

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O1

void __thiscall
helics::apps::App::loadFile(App *this,string *filename,bool enableFederateInterfaceRegistration)

{
  bool bVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined7 in_register_00000011;
  string_view jsonString;
  string_view tomlString;
  string_view message;
  char *extraout_RDX;
  
  jsonString._M_str._1_7_ = in_register_00000011;
  jsonString._M_str._0_1_ = enableFederateInterfaceRegistration;
  jsonString._M_len = (size_t)(filename->_M_dataplus)._M_p;
  bVar1 = fileops::hasJsonExtension((fileops *)filename->_M_string_length,jsonString);
  if (bVar1) {
    (*this->_vptr_App[6])(this,filename,enableFederateInterfaceRegistration);
    return;
  }
  tomlString._M_str = extraout_RDX;
  tomlString._M_len = (size_t)(filename->_M_dataplus)._M_p;
  bVar1 = fileops::hasTomlExtension((fileops *)filename->_M_string_length,tomlString);
  if (bVar1) {
    this = (App *)(this->fed).
                  super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (!enableFederateInterfaceRegistration) {
      message._M_str = "Toml files are not support for app configuration";
      message._M_len = 0x30;
      Federate::logMessage
                ((Federate *)((long)&this->_vptr_App + (long)this->_vptr_App[-3]),3,message);
      return;
    }
    UNRECOVERED_JUMPTABLE = this->_vptr_App[3];
  }
  else {
    UNRECOVERED_JUMPTABLE = this->_vptr_App[7];
  }
  (*UNRECOVERED_JUMPTABLE)(this,filename);
  return;
}

Assistant:

void App::loadFile(const std::string& filename, bool enableFederateInterfaceRegistration)
{
    if (fileops::hasJsonExtension(filename)) {
        loadJsonFile(filename, enableFederateInterfaceRegistration);
    } else if (fileops::hasTomlExtension(filename)) {
        if (enableFederateInterfaceRegistration) {
            fed->registerInterfaces(filename);
        } else {
            fed->logWarningMessage("Toml files are not support for app configuration");
        }
    } else {
        loadTextFile(filename);
    }
}